

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnArrayType
          (BinaryReaderObjdump *this,Index index,TypeMut field)

{
  undefined4 in_register_00000034;
  Type local_40;
  char local_38;
  string local_30;
  
  local_40 = field.type;
  local_38 = field.mutable_;
  if ((((this->super_BinaryReaderObjdumpBase).options_)->mode == Details) &&
     (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
    printf(" - type[%u] (array",CONCAT44(in_register_00000034,index));
    if (((undefined1  [12])field & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
      printf(" (mut");
    }
    Type::GetName_abi_cxx11_(&local_30,&local_40);
    printf(" %s",local_30._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    if (local_38 == '\x01') {
      putchar(0x29);
    }
    puts(")");
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnArrayType(Index index, TypeMut field) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }
  printf(" - type[%" PRIindex "] (array", index);
  if (field.mutable_) {
    printf(" (mut");
  }
  printf(" %s", field.type.GetName().c_str());
  if (field.mutable_) {
    printf(")");
  }
  printf(")\n");
  return Result::Ok;
}